

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O2

bool __thiscall gutil::Parameter::findParameter(Parameter *this,string *p)

{
  pointer pbVar1;
  __type _Var2;
  long lVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  
  lVar3 = 0;
  uVar5 = 0;
  do {
    pbVar1 = (this->list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->list).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (uVar4 <= uVar5) {
LAB_0010a6e4:
      return uVar5 < uVar4;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar3),p);
    if (_Var2) {
      this->cparam = uVar5;
      this->pos = uVar5 + 1;
      goto LAB_0010a6e4;
    }
    uVar5 = uVar5 + 1;
    lVar3 = lVar3 + 0x20;
  } while( true );
}

Assistant:

bool Parameter::findParameter(const std::string &p)
{
  assert(allparam.find(p) != allparam.end());

  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i] == p)
    {
      cparam=i;
      pos=i+1;

      return true;
    }
  }

  return false;
}